

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_world.cc
# Opt level: O2

void sptk::world::rftfsub(int n,double *a,int nc,double *c)

{
  double dVar1;
  double dVar2;
  long lVar3;
  double *pdVar4;
  double *pdVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  lVar6 = (long)n;
  lVar3 = (long)((nc * 2) / (n >> 1));
  pdVar5 = c + lVar3;
  pdVar4 = c + (nc - lVar3);
  for (lVar7 = 2; lVar6 = lVar6 + -2, lVar7 < n >> 1; lVar7 = lVar7 + 2) {
    dVar1 = a[lVar7];
    dVar2 = (a + lVar7)[1];
    dVar10 = dVar1 - a[lVar6];
    dVar9 = (a + lVar6)[1] + dVar2;
    dVar8 = (0.5 - *pdVar4) * dVar10 + -*pdVar5 * dVar9;
    dVar9 = (0.5 - *pdVar4) * dVar9 + *pdVar5 * dVar10;
    a[lVar7] = dVar1 - dVar8;
    (a + lVar7)[1] = dVar2 - dVar9;
    dVar1 = (a + lVar6)[1];
    a[lVar6] = a[lVar6] + dVar8;
    (a + lVar6)[1] = dVar1 - dVar9;
    pdVar5 = pdVar5 + lVar3;
    pdVar4 = pdVar4 + -lVar3;
  }
  return;
}

Assistant:

void rftfsub(int n, double *a, int nc, double *c) {
  int j, k, kk, ks, m;
  double wkr, wki, xr, xi, yr, yi;

  m = n >> 1;
  ks = 2 * nc / m;
  kk = 0;
  for (j = 2; j < m; j += 2) {
    k = n - j;
    kk += ks;
    wkr = 0.5 - c[nc - kk];
    wki = c[kk];
    xr = a[j] - a[k];
    xi = a[j + 1] + a[k + 1];
    yr = wkr * xr - wki * xi;
    yi = wkr * xi + wki * xr;
    a[j] -= yr;
    a[j + 1] -= yi;
    a[k] += yr;
    a[k + 1] -= yi;
  }
}